

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

void __thiscall OpenMD::ZConstraintForceModifier::updateZPos(ZConstraintForceModifier *this)

{
  double dVar1;
  _List_node_base *p_Var2;
  
  dVar1 = this->zconsGap_;
  p_Var2 = (_List_node_base *)&this->fixedZMols_;
  while (p_Var2 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->fixedZMols_) {
    p_Var2[1]._M_prev = (_List_node_base *)((double)p_Var2[1]._M_prev + dVar1);
  }
  return;
}

Assistant:

void ZConstraintForceModifier::updateZPos() {
    std::list<ZconstraintMol>::iterator i;
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      i->param.zTargetPos += zconsGap_;
    }
  }